

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  Headers *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  HandlerResponse HVar8;
  int iVar9;
  char *pcVar10;
  _Alloc_hider _Var11;
  ostream *poVar12;
  const_iterator cVar13;
  ssize_t sVar14;
  long lVar15;
  int extraout_var;
  int extraout_var_00;
  char *pcVar16;
  size_t offset;
  ulong uVar17;
  size_t offset_1;
  ulong uVar18;
  bool bVar19;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar20;
  string content_type;
  string boundary;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  Request *local_268;
  Server *local_260;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  key_type local_1f8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined8 local_1b0;
  ios_base local_158 [264];
  long *local_50 [2];
  long local_40 [2];
  
  local_268 = req;
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar8 = (*(this->error_handler_)._M_invoker)((_Any_data *)&this->error_handler_,req,res);
    need_apply_ranges = HVar8 == Handled || need_apply_ranges;
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  if (need_apply_ranges != false) {
    apply_ranges(this,local_268,res,&local_258,&local_238);
  }
  bVar19 = true;
  local_260 = this;
  if (!close_connection) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Connection","");
    pVar20 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(&(local_268->headers)._M_t,&local_1f8);
    if (pVar20.first._M_node._M_node == pVar20.second._M_node._M_node) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(pVar20.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,pcVar10,(allocator<char> *)local_1d8);
    iVar9 = std::__cxx11::string::compare((char *)local_50);
    bVar19 = iVar9 == 0;
  }
  if (!close_connection) {
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar19) {
    local_1d8._0_8_ = local_1d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Connection","");
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"close","");
    cVar2 = *(char *)local_1d8._0_8_;
    pcVar10 = (char *)local_1d8._0_8_;
    while (((cVar2 != '\0' && (pcVar10 = pcVar10 + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
      cVar2 = *pcVar10;
    }
    if (cVar2 == '\0') {
      cVar2 = *local_288._M_dataplus._M_p;
      _Var11._M_p = local_288._M_dataplus._M_p;
      while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')))
      {
        cVar2 = *_Var11._M_p;
      }
      if (cVar2 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   &local_288);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1d8 + 0x10),"timeout=",8);
    poVar12 = std::ostream::_M_insert<long>((long)(local_1d8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,", max=",6);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Keep-Alive","");
    std::__cxx11::stringbuf::str();
    cVar2 = *local_288._M_dataplus._M_p;
    _Var11._M_p = local_288._M_dataplus._M_p;
    while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
      cVar2 = *_Var11._M_p;
    }
    if (cVar2 == '\0') {
      cVar2 = *local_218._M_dataplus._M_p;
      _Var11._M_p = local_218._M_dataplus._M_p;
      while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')))
      {
        cVar2 = *_Var11._M_p;
      }
      if (cVar2 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,&local_288,&local_218);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  pcVar10 = local_1d8 + 0x10;
  local_1d8._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Type","");
  this_00 = &res->headers;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  p_Var1 = &(res->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar13._M_node == p_Var1) {
    if (res->content_length_ != 0 || (res->body)._M_string_length != 0) {
      if ((char *)local_1d8._0_8_ != pcVar10) {
        operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
      }
LAB_0013981e:
      local_1d8._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Type","");
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"text/plain","");
      cVar2 = *(char *)local_1d8._0_8_;
      pcVar16 = (char *)local_1d8._0_8_;
      while (((cVar2 != '\0' && (pcVar16 = pcVar16 + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = *pcVar16;
      }
      if (cVar2 == '\0') {
        cVar2 = *local_288._M_dataplus._M_p;
        _Var11._M_p = local_288._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_288);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001398e9;
    }
    p_Var3 = (res->content_provider_).super__Function_base._M_manager;
    if ((char *)local_1d8._0_8_ != pcVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (p_Var3 != (_Manager_type)0x0) goto LAB_0013981e;
  }
  else {
LAB_001398e9:
    if ((char *)local_1d8._0_8_ != pcVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  local_1d8._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Length","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  if (((_Rb_tree_header *)cVar13._M_node == p_Var1) &&
     (res->content_length_ == 0 && (res->body)._M_string_length == 0)) {
    p_Var3 = (res->content_provider_).super__Function_base._M_manager;
    if ((char *)local_1d8._0_8_ != pcVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    local_1d8._0_8_ = local_1d8 + 0x10;
    if (p_Var3 == (_Manager_type)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Content-Length","");
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"0","");
      cVar2 = *(char *)local_1d8._0_8_;
      pcVar10 = (char *)local_1d8._0_8_;
      while (((cVar2 != '\0' && (pcVar10 = pcVar10 + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = *pcVar10;
      }
      if (cVar2 == '\0') {
        cVar2 = *local_288._M_dataplus._M_p;
        _Var11._M_p = local_288._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_288);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00139a66;
    }
  }
  else {
LAB_00139a66:
    if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  pcVar10 = local_1d8 + 0x10;
  local_1d8._0_8_ = pcVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Accept-Ranges","");
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this_00->_M_t,(key_type *)local_1d8);
  if ((_Rb_tree_header *)cVar13._M_node == p_Var1) {
    iVar9 = std::__cxx11::string::compare((char *)local_268);
    if ((char *)local_1d8._0_8_ != pcVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    if (iVar9 == 0) {
      local_1d8._0_8_ = pcVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Accept-Ranges","");
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"bytes","");
      cVar2 = *(char *)local_1d8._0_8_;
      pcVar16 = (char *)local_1d8._0_8_;
      while (((cVar2 != '\0' && (pcVar16 = pcVar16 + 1, cVar2 != '\n')) && (cVar2 != '\r'))) {
        cVar2 = *pcVar16;
      }
      if (cVar2 == '\0') {
        cVar2 = *local_288._M_dataplus._M_p;
        _Var11._M_p = local_288._M_dataplus._M_p;
        while (((cVar2 != '\0' && (_Var11._M_p = _Var11._M_p + 1, cVar2 != '\n')) && (cVar2 != '\r')
               )) {
          cVar2 = *_Var11._M_p;
        }
        if (cVar2 == '\0') {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_288);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00139ab6;
    }
  }
  else {
LAB_00139ab6:
    if ((char *)local_1d8._0_8_ != pcVar10) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
  }
  if ((local_260->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(local_260->post_routing_handler_)._M_invoker)
              ((_Any_data *)&local_260->post_routing_handler_,local_268,res);
  }
  puVar5 = local_1d8 + 0x18;
  local_1d8._0_8_ = &PTR__BufferStream_001c43b0;
  local_1c8._M_allocated_capacity = 0;
  local_1c8._M_local_buf[8] = '\0';
  local_1b0 = 0;
  local_1d8._8_8_ = puVar5;
  local_288._M_dataplus._M_p = status_message(res->status);
  sVar14 = Stream::write_format<int,char_const*>
                     ((Stream *)local_1d8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_288);
  if (sVar14 != 0) {
    if ((local_260->header_writer_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    lVar15 = (*(local_260->header_writer_)._M_invoker)
                       ((_Any_data *)&local_260->header_writer_,(Stream *)local_1d8,this_00);
    uVar7 = local_1c8._M_allocated_capacity;
    uVar6 = local_1d8._8_8_;
    if (lVar15 != 0) {
      uVar17 = 0;
      do {
        if ((ulong)uVar7 <= uVar17) break;
        iVar9 = (*strm->_vptr_Stream[5])(strm,(undefined1 *)(uVar6 + uVar17));
        lVar15 = 0;
        if (-1 < extraout_var) {
          lVar15 = CONCAT44(extraout_var,iVar9);
        }
        uVar17 = uVar17 + lVar15;
      } while (-1 < extraout_var);
      local_1d8._0_8_ = &PTR__BufferStream_001c43b0;
      if ((undefined1 *)local_1d8._8_8_ != puVar5) {
        operator_delete((void *)local_1d8._8_8_,
                        CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1);
      }
      iVar9 = std::__cxx11::string::compare((char *)local_268);
      bVar19 = true;
      if (iVar9 != 0) {
        uVar17 = (res->body)._M_string_length;
        if (uVar17 == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar19 = write_content_with_provider(local_260,strm,local_268,res,&local_238,&local_258)
            ;
            res->content_provider_success_ = bVar19;
          }
        }
        else {
          pcVar4 = (res->body)._M_dataplus._M_p;
          uVar18 = 0;
          do {
            bVar19 = uVar17 <= uVar18;
            if (uVar17 <= uVar18) break;
            iVar9 = (*strm->_vptr_Stream[5])(strm,pcVar4 + uVar18);
            lVar15 = 0;
            if (-1 < extraout_var_00) {
              lVar15 = CONCAT44(extraout_var_00,iVar9);
            }
            uVar18 = uVar18 + lVar15;
          } while (-1 < extraout_var_00);
        }
      }
      if ((local_260->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(local_260->logger_)._M_invoker)((_Any_data *)&local_260->logger_,local_268,res);
      }
      goto LAB_00139df7;
    }
  }
  local_1d8._0_8_ = &PTR__BufferStream_001c43b0;
  if ((undefined1 *)local_1d8._8_8_ != puVar5) {
    operator_delete((void *)local_1d8._8_8_,CONCAT71(local_1c8._9_7_,local_1c8._M_local_buf[8]) + 1)
    ;
  }
  bVar19 = false;
LAB_00139df7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  return bVar19;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            status_message(res.status))) {
      return false;
    }

    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}